

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileContext.cpp
# Opt level: O2

string * __thiscall
enact::CompileContext::getSourceLine_abi_cxx11_
          (string *__return_storage_ptr__,CompileContext *this,line_t line)

{
  istream *piVar1;
  uint uVar2;
  bool bVar3;
  istringstream stream;
  
  std::__cxx11::istringstream::istringstream((istringstream *)&stream,(string *)this,_S_in);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar2 = 1;
  do {
    piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&stream,(string *)__return_storage_ptr__);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    bVar3 = uVar2 < line;
    uVar2 = uVar2 + 1;
  } while (bVar3);
  std::__cxx11::istringstream::~istringstream((istringstream *)&stream);
  return __return_storage_ptr__;
}

Assistant:

std::string CompileContext::getSourceLine(line_t line) {
        std::istringstream stream{m_source};
        line_t lineNumber{1};
        std::string lineContents;

        while (std::getline(stream, lineContents) && lineNumber < line) {
            ++lineNumber;
        }

        return lineContents;
    }